

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tokenizer.cc
# Opt level: O0

void __thiscall Finder::Finder(Finder *this,shared_ptr<InputSource> *is,string *str)

{
  string *str_local;
  shared_ptr<InputSource> *is_local;
  Finder *this_local;
  
  InputSource::Finder::Finder(&this->super_Finder);
  (this->super_Finder)._vptr_Finder = (_func_int **)&PTR__Finder_0010ebc8;
  std::shared_ptr<InputSource>::shared_ptr(&this->is,is);
  std::__cxx11::string::string((string *)&this->str,(string *)str);
  return;
}

Assistant:

Finder(std::shared_ptr<InputSource> is, std::string const& str) :
        is(is),
        str(str)
    {
    }